

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comments.cpp
# Opt level: O0

void __thiscall
Comments_CommentsCannotContainControlCharacters_Test::
Comments_CommentsCannotContainControlCharacters_Test
          (Comments_CommentsCannotContainControlCharacters_Test *this)

{
  Comments_CommentsCannotContainControlCharacters_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Comments_CommentsCannotContainControlCharacters_Test_00228e18;
  return;
}

Assistant:

TEST(Comments, CommentsCannotContainControlCharacters) {
    std::istringstream input("# this comment ends here -->\b and after that will be an error");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(28, e.offset());
    }
}